

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

void * secp256k1_scratch_alloc
                 (secp256k1_callback *error_callback,secp256k1_scratch *scratch,size_t size)

{
  int iVar1;
  secp256k1_callback *__n;
  secp256k1_callback *in_RDX;
  void *in_RSI;
  size_t rounded_size;
  void *ret;
  char *in_stack_ffffffffffffffc8;
  secp256k1_callback *cb;
  void *local_8;
  
  __n = (secp256k1_callback *)((ulong)((long)&in_RDX->data + 7U) & 0xfffffffffffffff0);
  if (__n < in_RDX) {
    local_8 = (void *)0x0;
  }
  else {
    cb = __n;
    iVar1 = secp256k1_memcmp_var(in_RSI,"scratch",8);
    if (iVar1 == 0) {
      if ((secp256k1_callback *)(*(long *)((long)in_RSI + 0x18) - *(long *)((long)in_RSI + 0x10)) <
          __n) {
        local_8 = (void *)0x0;
      }
      else {
        local_8 = (void *)(*(long *)((long)in_RSI + 8) + *(long *)((long)in_RSI + 0x10));
        memset(local_8,0,(size_t)__n);
        *(long *)((long)in_RSI + 0x10) = (long)&__n->fn + *(long *)((long)in_RSI + 0x10);
      }
    }
    else {
      secp256k1_callback_call(cb,in_stack_ffffffffffffffc8);
      local_8 = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

static void *secp256k1_scratch_alloc(const secp256k1_callback* error_callback, secp256k1_scratch* scratch, size_t size) {
    void *ret;
    size_t rounded_size;

    rounded_size = ROUND_TO_ALIGN(size);
    /* Check that rounding did not wrap around */
    if (rounded_size < size) {
        return NULL;
    }
    size = rounded_size;

    if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
        secp256k1_callback_call(error_callback, "invalid scratch space");
        return NULL;
    }

    if (size > scratch->max_size - scratch->alloc_size) {
        return NULL;
    }
    ret = (void *) ((char *) scratch->data + scratch->alloc_size);
    memset(ret, 0, size);
    scratch->alloc_size += size;

    return ret;
}